

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(GlobOptBlockData *this,SymID typeSymId)

{
  code *pcVar1;
  bool bVar2;
  Value *this_00;
  ValueInfo *this_01;
  undefined4 *puVar3;
  Value *value;
  SymID typeSymId_local;
  GlobOptBlockData *this_local;
  
  this_00 = FindValueFromMapDirect(this,typeSymId);
  if (this_00 != (Value *)0x0) {
    this_01 = ::Value::GetValueInfo(this_00);
    bVar2 = ValueInfo::IsJsType(this_01);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x53d,"(value == nullptr || value->GetValueInfo()->IsJsType())",
                         "value == nullptr || value->GetValueInfo()->IsJsType()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return this_00;
}

Assistant:

Value *
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(SymID typeSymId)
{
    Value* value = this->FindValueFromMapDirect(typeSymId);
    Assert(value == nullptr || value->GetValueInfo()->IsJsType());
    return value;
}